

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

void __thiscall tf::Runtime::corun(Runtime *this)

{
  atomic<int> *paVar1;
  Node *pNVar2;
  anon_class_8_1_8991fb9c local_18;
  
  pNVar2 = this->_parent;
  LOCK();
  paVar1 = &pNVar2->_estate;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i | 0x40000000;
  UNLOCK();
  local_18.this = this;
  Executor::_corun_until<tf::Runtime::corun()::_lambda()_1_>
            (this->_executor,this->_worker,&local_18);
  LOCK();
  paVar1 = &pNVar2->_estate;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i & 0xbfffffff;
  UNLOCK();
  Node::_rethrow_exception(this->_parent);
  return;
}

Assistant:

inline void Runtime::corun() {
  {
    AnchorGuard anchor(_parent);
    _executor._corun_until(_worker, [this] () -> bool {
      return _parent->_join_counter.load(std::memory_order_acquire) == 0;
    });
  }
  _parent->_rethrow_exception();
}